

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerField.cpp
# Opt level: O2

void __thiscall IntegerField::IntegerField(IntegerField *this,string *name,int size)

{
  IntegerElement *pIVar1;
  int iVar2;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Tag::Tag(&this->super_Tag,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_0010ad08;
  if (size == 0) {
    pIVar1 = (IntegerElement *)operator_new(0x48);
    IntegerElement::IntegerElement(pIVar1);
    Tag::addElement(&this->super_Tag,(StreamObject *)pIVar1);
  }
  else {
    iVar2 = 0;
    if (0 < size) {
      iVar2 = size;
    }
    while (iVar2 != 0) {
      pIVar1 = (IntegerElement *)operator_new(0x48);
      IntegerElement::IntegerElement(pIVar1);
      Tag::addElement(&this->super_Tag,(StreamObject *)pIVar1);
      iVar2 = iVar2 + -1;
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = size;
  return;
}

Assistant:

IntegerField::IntegerField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new IntegerElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new IntegerElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}